

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldebug.c
# Opt level: O2

char * funcnamefromcall(lua_State *L,CallInfo *ci,char **name)

{
  uint uVar1;
  Proto *p;
  int lastpc;
  char *pcVar2;
  char *pcStack_20;
  
  uVar1 = ci->callstatus;
  if ((uVar1 >> 0x14 & 1) != 0) {
    *name = "?";
    return "hook";
  }
  if ((uVar1 >> 0x18 & 1) != 0) {
    pcVar2 = "__gc";
    goto LAB_00109dcd;
  }
  if ((short)uVar1 < 0) {
    return (char *)0x0;
  }
  p = *(Proto **)((((ci->func).p)->val).value_.f + 0x18);
  lastpc = currentpc(ci);
  uVar1 = p->code[lastpc];
  pcStack_20 = (char *)0x0;
  switch(uVar1 & 0x7f) {
  case 0xb:
  case 0xc:
  case 0xd:
  case 0xe:
  case 0x14:
    break;
  case 0xf:
  case 0x10:
  case 0x11:
  case 0x12:
    pcStack_20 = (char *)0x1;
    break;
  default:
    goto switchD_00109d4e_caseD_13;
  case 0x2e:
  case 0x2f:
  case 0x30:
    pcStack_20 = (char *)(ulong)(uVar1 >> 0x18);
    break;
  case 0x31:
    pcStack_20 = (char *)0x12;
    break;
  case 0x32:
    pcStack_20 = (char *)0x13;
    break;
  case 0x34:
    pcStack_20 = (char *)0x4;
    break;
  case 0x35:
    pcStack_20 = (char *)0x16;
    break;
  case 0x36:
  case 0x46:
    pcStack_20 = (char *)0x18;
    break;
  case 0x39:
    pcStack_20 = (char *)0x5;
    break;
  case 0x3a:
  case 0x3e:
  case 0x40:
    pcStack_20 = (char *)0x14;
    break;
  case 0x3b:
  case 0x3f:
  case 0x41:
    pcStack_20 = (char *)0x15;
    break;
  case 0x44:
  case 0x45:
    pcVar2 = getobjname(p,lastpc,uVar1 >> 7 & 0xff,name);
    return pcVar2;
  case 0x4c:
    pcStack_20 = "for iterator";
    *name = "for iterator";
    goto switchD_00109d4e_caseD_13;
  }
  pcVar2 = (char *)((long)&L->l_G->tmname[(long)pcStack_20]->contents + 2);
LAB_00109dcd:
  *name = pcVar2;
  pcStack_20 = "metamethod";
switchD_00109d4e_caseD_13:
  return pcStack_20;
}

Assistant:

static const char *funcnamefromcall (lua_State *L, CallInfo *ci,
                                                   const char **name) {
  if (ci->callstatus & CIST_HOOKED) {  /* was it called inside a hook? */
    *name = "?";
    return "hook";
  }
  else if (ci->callstatus & CIST_FIN) {  /* was it called as a finalizer? */
    *name = "__gc";
    return "metamethod";  /* report it as such */
  }
  else if (isLua(ci))
    return funcnamefromcode(L, ci_func(ci)->p, currentpc(ci), name);
  else
    return NULL;
}